

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::ParseMetaData(Parser *this,SymbolTable<flatbuffers::Value> *attributes)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  iterator iVar4;
  Value *e;
  SymbolTable<flatbuffers::Value> *in_RDX;
  CheckedError *ce;
  char cVar5;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  EnumDef **local_68;
  EnumDef *local_58 [2];
  _Alloc_hider local_48;
  _Base_ptr local_40;
  undefined8 local_38;
  
  if (*(int *)((long)&(attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 4)
      == 0x28) {
    local_48._M_p = (pointer)in_RDX;
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010b748;
    local_38 = &attributes[0xd].dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_40 = (_Base_ptr)&attributes[0xd].dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    do {
      local_68 = local_58;
      sVar2 = (attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,sVar2,
                 (long)(attributes->vec).
                       super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar2);
      iVar1 = *(int *)((long)&(attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left + 4);
      if ((iVar1 == 0x101) || (iVar1 == 0x104)) {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        *)local_38,(key_type *)&local_68);
        if (iVar4._M_node == local_40) {
          std::operator+(&local_88,"user define attributes must be declared before use: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_68);
          Error(this,(string *)attributes);
          goto LAB_0010b6df;
        }
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        cVar5 = '\x01';
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          e = (Value *)operator_new(0x48);
          *(undefined8 *)((long)&(e->type).struct_def + 2) = 0;
          *(undefined8 *)((long)&(e->type).enum_def + 2) = 0;
          (e->type).base_type = BASE_TYPE_NONE;
          (e->type).element = BASE_TYPE_NONE;
          (e->type).struct_def = (StructDef *)0x0;
          (e->constant)._M_dataplus._M_p = (pointer)&(e->constant).field_2;
          *(undefined2 *)&(e->constant).field_2 = 0x30;
          (e->constant)._M_string_length = 1;
          e->offset = 0xffff;
          bVar3 = SymbolTable<flatbuffers::Value>::Add
                            ((SymbolTable<flatbuffers::Value> *)local_48._M_p,(string *)&local_68,e)
          ;
          if (bVar3) {
            std::operator+(&local_88,"attribute already found: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_68);
            Warning((Parser *)attributes,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          if (*(int *)((long)&(attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left + 4) == 0x3a) {
            Next(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              ParseSingleValue(this,(string *)attributes,(Value *)&local_68,SUB81(e,0));
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0010b671;
            }
          }
          else {
LAB_0010b671:
            if (*(int *)((long)&(attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_left + 4) == 0x29) {
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              cVar5 = *(char *)&(this->super_ParserState).prev_cursor_;
              if (cVar5 == '\0') {
                cVar5 = '\x02';
              }
            }
            else {
              Expect(this,(int)attributes);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              cVar5 = *(char *)&(this->super_ParserState).prev_cursor_;
            }
          }
        }
      }
      else {
        std::operator+(&local_88,"attribute name must be either identifier or string: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_68);
        Error(this,(string *)attributes);
LAB_0010b6df:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        cVar5 = '\x01';
      }
      if (local_68 != local_58) {
        operator_delete(local_68,(ulong)((long)&(local_58[0]->super_Definition).name._M_dataplus.
                                                _M_p + 1));
      }
    } while (cVar5 == '\0');
    if (cVar5 == '\x01') goto LAB_0010b748;
  }
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_0010b748:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseMetaData(SymbolTable<Value> *attributes) {
  if (Is('(')) {
    NEXT();
    for (;;) {
      auto name = attribute_;
      if (false == (Is(kTokenIdentifier) || Is(kTokenStringConstant)))
        return Error("attribute name must be either identifier or string: " +
                     name);
      if (known_attributes_.find(name) == known_attributes_.end())
        return Error("user define attributes must be declared before use: " +
                     name);
      NEXT();
      auto e = new Value();
      if (attributes->Add(name, e)) Warning("attribute already found: " + name);
      if (Is(':')) {
        NEXT();
        ECHECK(ParseSingleValue(&name, *e, true));
      }
      if (Is(')')) {
        NEXT();
        break;
      }
      EXPECT(',');
    }
  }
  return NoError();
}